

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

void __thiscall minihttp::SocketSet::deleteAll(SocketSet *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = *(_Rb_tree_node_base **)&this->field_0x20;
      p_Var1 != (_Rb_tree_node_base *)&this->field_0x10;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 1) + 8))();
    }
  }
  std::
  _Rb_tree<minihttp::TcpSocket_*,_std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>,_std::_Select1st<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>,_std::less<minihttp::TcpSocket_*>,_std::allocator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>_>
  ::clear((_Rb_tree<minihttp::TcpSocket_*,_std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>,_std::_Select1st<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>,_std::less<minihttp::TcpSocket_*>,_std::allocator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>_>
           *)&this->_store);
  return;
}

Assistant:

void SocketSet::deleteAll(void)
{
    for(Store::iterator it = _store.begin(); it != _store.end(); ++it)
        delete it->first;
    _store.clear();
}